

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  ushort uVar1;
  ushort uVar2;
  sqlite3 *db;
  Index *pIdx;
  bool bVar3;
  int iVar4;
  int iVar5;
  int p3;
  int p2;
  int p3_00;
  int p2_00;
  int p2_01;
  int p1;
  int p2_02;
  int iVar6;
  Vdbe *p;
  void *p_00;
  CollSeq *zP4;
  int p1_00;
  uint p1_01;
  int p2_03;
  char *pcVar7;
  ulong uVar8;
  Index **ppIVar9;
  ulong uVar10;
  
  db = pParse->db;
  p1_00 = iMem + 7;
  iVar4 = pParse->nMem;
  if (pParse->nMem <= p1_00) {
    iVar4 = p1_00;
  }
  pParse->nMem = iVar4;
  p = sqlite3GetVdbe(pParse);
  if ((pTab != (Table *)0x0 && p != (Vdbe *)0x0) && (pTab->tnum != 0)) {
    pcVar7 = pTab->zName;
    iVar4 = sqlite3_strnicmp(pcVar7,"sqlite_",7);
    if (iVar4 != 0) {
      iVar4 = sqlite3SchemaToIndex(db,pTab->pSchema);
      iVar5 = sqlite3AuthCheck(pParse,0x1c,pcVar7,(char *)0x0,db->aDb[iVar4].zName);
      if (iVar5 == 0) {
        p3 = iMem + 1;
        p2 = iMem + 2;
        p3_00 = iMem + 3;
        p2_00 = iMem + 4;
        p2_01 = iMem + 6;
        sqlite3TableLock(pParse,iVar4,pTab->tnum,'\0',pTab->zName);
        p1 = iTab + 1;
        iVar5 = iTab + 2;
        if (iTab + 2 < pParse->nTab) {
          iVar5 = pParse->nTab;
        }
        pParse->nTab = iVar5;
        sqlite3OpenTable(pParse,iTab,iVar4,pTab,0x36);
        sqlite3VdbeAddOp4(p,0x61,0,p2_00,0,pTab->zName,0);
        bVar3 = true;
        ppIVar9 = &pTab->pIndex;
        while (pIdx = *ppIVar9, pIdx != (Index *)0x0) {
          if (pOnlyIdx == (Index *)0x0 || pIdx == pOnlyIdx) {
            if (pIdx->pPartIdxWhere == (Expr *)0x0) {
              bVar3 = false;
            }
            if (((pTab->tabFlags & 0x20) == 0) || ((pIdx->field_0x5b & 3) != 2)) {
              uVar1 = pIdx->nColumn;
              pcVar7 = pIdx->zName;
              uVar2 = uVar1;
              if ((pIdx->field_0x5b & 8) != 0) {
                uVar2 = pIdx->nKeyCol;
              }
            }
            else {
              uVar1 = pIdx->nKeyCol;
              pcVar7 = pTab->zName;
              uVar2 = uVar1;
            }
            sqlite3VdbeAddOp4(p,0x61,0,iMem + 5,0,pcVar7,0);
            iVar5 = p1_00 + (uint)uVar2 + -1;
            if (iVar5 < pParse->nMem) {
              iVar5 = pParse->nMem;
            }
            pParse->nMem = iVar5;
            sqlite3VdbeAddOp3(p,0x36,p1,pIdx->tnum,iVar4);
            sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
            sqlite3VdbeAddOp2(p,0x19,(uint)uVar1,p2);
            sqlite3VdbeAddOp2(p,0x19,(uint)pIdx->nKeyCol,p3_00);
            sqlite3VdbeAddOp3(p,1,0,p2,p3);
            sqlite3VdbeChangeP4(p,-1,(char *)&statInitFuncdef,-5);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x02';
            }
            iVar5 = sqlite3VdbeAddOp1(p,0x6c,p1);
            sqlite3VdbeAddOp2(p,0x19,0,p2);
            if (uVar2 < 2) {
              p2_03 = p->nOp;
            }
            else {
              p1_01 = uVar2 - 1;
              p2_02 = sqlite3VdbeMakeLabel(p);
              uVar8 = (ulong)p1_01;
              p_00 = sqlite3DbMallocRaw(db,uVar8 * 4);
              if (p_00 == (void *)0x0) goto LAB_00161213;
              sqlite3VdbeAddOp0(p,0x10);
              p2_03 = p->nOp;
              if (((p1_01 == 1) && (pIdx->nKeyCol == 1)) && (pIdx->onError != '\0')) {
                sqlite3VdbeAddOp2(p,0x4d,p1_00,p2_02);
              }
              for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
                zP4 = sqlite3LocateCollSeq(pParse,pIdx->azColl[uVar10]);
                iVar6 = (int)uVar10;
                sqlite3VdbeAddOp2(p,0x19,iVar6,p2);
                sqlite3VdbeAddOp3(p,0x2f,p1,iVar6,p3_00);
                iVar6 = sqlite3VdbeAddOp4(p,0x4e,p3_00,0,p1_00 + iVar6,(char *)zP4,-4);
                *(int *)((long)p_00 + uVar10 * 4) = iVar6;
                if (p->aOp != (Op *)0x0) {
                  p->aOp[(long)p->nOp + -1].p5 = 0x80;
                }
              }
              sqlite3VdbeAddOp2(p,0x19,p1_01,p2);
              sqlite3VdbeAddOp2(p,0x10,0,p2_02);
              sqlite3VdbeJumpHere(p,p2_03 + -1);
              for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
                sqlite3VdbeJumpHere(p,*(int *)((long)p_00 + uVar10 * 4));
                sqlite3VdbeAddOp3(p,0x2f,p1,(int)uVar10,p1_00 + (int)uVar10);
              }
              sqlite3VdbeResolveLabel(p,p2_02);
              sqlite3DbFree(db,p_00);
            }
            sqlite3VdbeAddOp3(p,1,1,p3,p3_00);
            sqlite3VdbeChangeP4(p,-1,(char *)&statPushFuncdef,-5);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x02';
            }
            sqlite3VdbeAddOp2(p,9,p1,p2_03);
            sqlite3VdbeAddOp3(p,1,0,p3,p2_01);
            sqlite3VdbeChangeP4(p,-1,(char *)&statGetFuncdef,-5);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x01';
            }
            sqlite3VdbeAddOp4(p,0x31,p2_00,3,p3_00,"BBB",0);
            sqlite3VdbeAddOp2(p,0x4a,iStatCur,iMem);
            sqlite3VdbeAddOp3(p,0x4b,iStatCur,p3_00,iMem);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\b';
            }
            sqlite3VdbeJumpHere(p,iVar5);
          }
LAB_00161213:
          ppIVar9 = &pIdx->pNext;
        }
        if ((pOnlyIdx == (Index *)0x0) && (bVar3)) {
          sqlite3VdbeAddOp2(p,0x32,iTab,p2_01);
          iVar4 = sqlite3VdbeAddOp1(p,0x2e,p2_01);
          sqlite3VdbeAddOp2(p,0x1c,0,iMem + 5);
          sqlite3VdbeAddOp4(p,0x31,p2_00,3,p3_00,"BBB",0);
          sqlite3VdbeAddOp2(p,0x4a,iStatCur,iMem);
          sqlite3VdbeAddOp3(p,0x4b,iStatCur,p3_00,iMem);
          if (p->aOp != (Op *)0x0) {
            p->aOp[(long)p->nOp + -1].p5 = '\b';
          }
          sqlite3VdbeJumpHere(p,iVar4);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat4 = iMem++;       /* Register to hold Stat4Accum object */
  int regChng = iMem++;        /* Index of changed index field */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
#endif
  int regTemp = iMem++;        /* Temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */

  pParse->nMem = MAX(pParse->nMem, iMem);
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( pTab->tnum==0 ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strnicmp(pTab->zName, "sqlite_", 7)==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zName ) ){
    return;
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level. 
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeAddOp4(v, OP_String8, 0, regTabname, 0, pTab->zName, 0);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrRewind;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeAddOp4(v, OP_String8, 0, regIdxname, 0, zIdxName, 0);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate 
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of 
    ** the sqlite_stat4 table.  */
    pParse->nMem = MAX(pParse->nMem, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Invoke the stat_init() function. The arguments are:
    ** 
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) the number of rows in the index,
    **
    **
    ** The third argument is only used for STAT3 and STAT4
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3VdbeAddOp2(v, OP_Count, iIdxCur, regStat4+3);
#endif
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat4+1);
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regStat4+2);
    sqlite3VdbeAddOp3(v, OP_Function, 0, regStat4+1, regStat4);
    sqlite3VdbeChangeP4(v, -1, (char*)&statInitFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);

    /* Implementation of the following:
    **
    **   Rewind csr
    **   if eof(csr) goto end_of_scan;
    **   regChng = 0
    **   goto next_push_0;
    **
    */
    addrRewind = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(v);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRaw(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip 
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        aGotoChng[i] = 
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, endDistinctTest);
  
  
      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }
  
    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT34 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT34 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    assert( regRowid==(regStat4+2) );
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
      int j, k, regKey;
      regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
      for(j=0; j<pPk->nKeyCol; j++){
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[j]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
        VdbeComment((v, "%s", pTab->aCol[pPk->aiColumn[j]].zName));
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
      sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
    }
#endif
    assert( regChng==(regStat4+1) );
    sqlite3VdbeAddOp3(v, OP_Function, 1, regStat4, regTemp);
    sqlite3VdbeChangeP4(v, -1, (char*)&statPushFuncdef, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, 2+IsStat34);
    sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);

    /* Add the entry to the stat1 table. */
    callStatGet(v, regStat4, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat3 or stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    {
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      pParse->nMem = MAX(pParse->nMem, regCol+nCol);

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(v, regStat4, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(v, regStat4, STAT_GET_NEQ, regEq);
      callStatGet(v, regStat4, STAT_GET_NLT, regLt);
      callStatGet(v, regStat4, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      /* We know that the regSampleRowid row exists because it was read by
      ** the previous loop.  Thus the not-found jump of seekOp will never
      ** be taken */
      VdbeCoverageNeverTaken(v);
#ifdef SQLITE_ENABLE_STAT3
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, 
                                      pIdx->aiColumn[0], regSample);
#else
      for(i=0; i<nCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, iCol, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
#endif
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

    /* End of analysis */
    sqlite3VdbeJumpHere(v, addrRewind);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}